

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O2

void telnet_negotiate(telnet_t *telnet,uchar cmd,uchar telopt)

{
  byte bVar1;
  telnet_rfc1143_t tVar2;
  ushort uVar3;
  byte him;
  uchar cmd_00;
  byte bStack_30;
  uchar bytes [3];
  
  if ((telnet->flags & 1) != 0) {
    bytes[0] = 0xff;
    bytes[1] = cmd;
    bytes[2] = telopt;
    _send(telnet,(char *)bytes,3);
    return;
  }
  tVar2 = _get_rfc1143(telnet,telopt);
  if (3 < cmd - 0xfb) {
    return;
  }
  uVar3 = (ushort)tVar2 >> 8;
  bVar1 = tVar2.state;
  switch((uint)cmd) {
  case 0xfb:
    if ((uVar3 & 0xf) == 5) {
      bStack_30 = 3;
    }
    else {
      if ((uVar3 & 0xf) != 2) {
        if ((uVar3 & 0xf) != 0) {
          return;
        }
        _set_rfc1143(telnet,telopt,'\x03',bVar1 >> 4);
        cmd_00 = 0xfb;
LAB_001027fa:
        _send_negotiate(telnet,cmd_00,telopt);
        return;
      }
      bStack_30 = 4;
    }
    break;
  case 0xfc:
    uVar3 = uVar3 & 0xf;
    if (uVar3 == 4) {
      bStack_30 = 2;
    }
    else {
      if (uVar3 != 3) {
        if (uVar3 != 1) {
          return;
        }
        _set_rfc1143(telnet,telopt,'\x02',bVar1 >> 4);
        cmd_00 = 0xfc;
        goto LAB_001027fa;
      }
      bStack_30 = 5;
    }
    break;
  case 0xfd:
    uVar3 = (ushort)tVar2 >> 0xc;
    if (uVar3 == 5) {
      bStack_30 = 3;
    }
    else {
      if (uVar3 != 2) {
        if (uVar3 != 0) {
          return;
        }
        _set_rfc1143(telnet,telopt,bVar1 & 0xf,'\x03');
        cmd_00 = 0xfd;
        goto LAB_001027fa;
      }
      bStack_30 = 4;
    }
    goto LAB_00102831;
  case 0xfe:
    uVar3 = (ushort)tVar2 >> 0xc;
    if (uVar3 == 4) {
      bStack_30 = 2;
    }
    else {
      if (uVar3 != 3) {
        if (uVar3 != 1) {
          return;
        }
        _set_rfc1143(telnet,telopt,bVar1 & 0xf,'\x02');
        cmd_00 = 0xfe;
        goto LAB_001027fa;
      }
      bStack_30 = 5;
    }
LAB_00102831:
    him = bStack_30;
    bStack_30 = bVar1 & 0xf;
    goto LAB_00102841;
  }
  him = bVar1 >> 4;
LAB_00102841:
  _set_rfc1143(telnet,telopt,bStack_30,him);
  return;
}

Assistant:

void telnet_negotiate(telnet_t *telnet, unsigned char cmd,
		unsigned char telopt) {
	telnet_rfc1143_t q;

	/* if we're in proxy mode, just send it now */
	if (telnet->flags & TELNET_FLAG_PROXY) {
		unsigned char bytes[3];
		bytes[0] = TELNET_IAC;
		bytes[1] = cmd;
		bytes[2] = telopt;
		_sendu(telnet, bytes, 3);
		return;
	}

	/* get current option states */
	q = _get_rfc1143(telnet, telopt);

	switch (cmd) {
	/* advertise willingess to support an option */
	case TELNET_WILL:
		switch (Q_US(q)) {
		case Q_NO:
			_set_rfc1143(telnet, telopt, Q_WANTYES, Q_HIM(q));
			_send_negotiate(telnet, TELNET_WILL, telopt);
			break;
		case Q_WANTNO:
			_set_rfc1143(telnet, telopt, Q_WANTNO_OP, Q_HIM(q));
			break;
		case Q_WANTYES_OP:
			_set_rfc1143(telnet, telopt, Q_WANTYES, Q_HIM(q));
			break;
		}
		break;

	/* force turn-off of locally enabled option */
	case TELNET_WONT:
		switch (Q_US(q)) {
		case Q_YES:
			_set_rfc1143(telnet, telopt, Q_WANTNO, Q_HIM(q));
			_send_negotiate(telnet, TELNET_WONT, telopt);
			break;
		case Q_WANTYES:
			_set_rfc1143(telnet, telopt, Q_WANTYES_OP, Q_HIM(q));
			break;
		case Q_WANTNO_OP:
			_set_rfc1143(telnet, telopt, Q_WANTNO, Q_HIM(q));
			break;
		}
		break;

	/* ask remote end to enable an option */
	case TELNET_DO:
		switch (Q_HIM(q)) {
		case Q_NO:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES);
			_send_negotiate(telnet, TELNET_DO, telopt);
			break;
		case Q_WANTNO:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO_OP);
			break;
		case Q_WANTYES_OP:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES);
			break;
		}
		break;

	/* demand remote end disable an option */
	case TELNET_DONT:
		switch (Q_HIM(q)) {
		case Q_YES:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO);
			_send_negotiate(telnet, TELNET_DONT, telopt);
			break;
		case Q_WANTYES:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES_OP);
			break;
		case Q_WANTNO_OP:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO);
			break;
		}
		break;
	}
}